

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  SQL sql;
  allocator aStack_7f291;
  string sStack_7f290;
  SQL SStack_7f270;
  
  SQL::SQL(&SStack_7f270);
  if (1 < argc) {
    std::__cxx11::string::string((string *)&sStack_7f290,argv[1],&aStack_7f291);
    SQL::execute_file(&SStack_7f270,&sStack_7f290);
    std::__cxx11::string::~string((string *)&sStack_7f290);
  }
  SQL::interactive(&SStack_7f270);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  system("pause");
  SQL::~SQL(&SStack_7f270);
  return 0;
}

Assistant:

int main(int argc, char const* argv[]) {
    SQL sql;
    if (argc > 1) {
        sql.execute_file(argv[1]);
    }
    sql.interactive();
    
    cout << endl;
    system("pause");
    return 0;
}